

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::Compiler::type_struct_member_offset(Compiler *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  Meta *pMVar2;
  Decoration *pDVar3;
  CompilerError *pCVar4;
  Decoration *dec;
  Meta *type_meta;
  uint32_t index_local;
  SPIRType *type_local;
  Compiler *this_local;
  
  pMVar2 = ParsedIR::find_meta(&this->ir,(ID)(type->super_IVariant).self.id);
  if (pMVar2 == (Meta *)0x0) {
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar4,"Struct member does not have Offset set.");
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  pDVar3 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                     (&(pMVar2->members).super_VectorView<spirv_cross::Meta::Decoration>,
                      (ulong)index);
  bVar1 = Bitset::get(&pDVar3->decoration_flags,0x23);
  if (!bVar1) {
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar4,"Struct member does not have Offset set.");
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  return pDVar3->offset;
}

Assistant:

uint32_t Compiler::type_struct_member_offset(const SPIRType &type, uint32_t index) const
{
	auto *type_meta = ir.find_meta(type.self);
	if (type_meta)
	{
		// Decoration must be set in valid SPIR-V, otherwise throw.
		auto &dec = type_meta->members[index];
		if (dec.decoration_flags.get(DecorationOffset))
			return dec.offset;
		else
			SPIRV_CROSS_THROW("Struct member does not have Offset set.");
	}
	else
		SPIRV_CROSS_THROW("Struct member does not have Offset set.");
}